

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_context.c
# Opt level: O0

GLFWglproc getProcAddressEGL(char *procname)

{
  _GLFWwindow *p_Var1;
  GLFWglproc proc;
  _GLFWwindow *window;
  char *procname_local;
  
  p_Var1 = _glfwPlatformGetCurrentContext();
  if (((p_Var1->context).egl.client == (void *)0x0) ||
     (procname_local = (char *)dlsym((p_Var1->context).egl.client,procname),
     procname_local == (char *)0x0)) {
    procname_local = (char *)(*_glfw.egl.GetProcAddress)(procname);
  }
  return (GLFWglproc)procname_local;
}

Assistant:

static GLFWglproc getProcAddressEGL(const char* procname)
{
    _GLFWwindow* window = _glfwPlatformGetCurrentContext();

    if (window->context.egl.client)
    {
        GLFWglproc proc = (GLFWglproc) _glfw_dlsym(window->context.egl.client,
                                                   procname);
        if (proc)
            return proc;
    }

    return eglGetProcAddress(procname);
}